

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cc
# Opt level: O0

string * ipx::Format_abi_cxx11_(double d,int width,int prec,fmtflags floatfield)

{
  int in_EDX;
  int in_ESI;
  string *in_RDI;
  double in_XMM0_Qa;
  ostringstream s;
  fmtflags in_stack_fffffffffffffe58;
  fmtflags in_stack_fffffffffffffe5c;
  ios_base *in_stack_fffffffffffffe60;
  long local_198 [48];
  int local_18;
  int local_14;
  double local_10;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_XMM0_Qa;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios_base::precision
            ((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),(long)local_18);
  std::ios_base::width
            ((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),(long)local_14);
  std::ios_base::setf(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)
  ;
  std::ostream::operator<<(local_198,local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return in_RDI;
}

Assistant:

std::string Format(double d, int width, int prec,
                   std::ios_base::fmtflags floatfield) {
    std::ostringstream s;
    s.precision(prec);
    s.width(width);
    s.setf(floatfield, std::ios_base::floatfield);
    s << d;
    return s.str();
}